

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Index __thiscall wabt::Module::GetFuncTypeIndex(Module *this,FuncSignature *sig)

{
  pointer ppFVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppFVar1 = (this->func_types).
              super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->func_types).
                      super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar3) {
      return 0xffffffff;
    }
    bVar2 = FuncSignature::operator==(&ppFVar1[uVar3]->sig,sig);
    if (bVar2) break;
    uVar3 = uVar3 + 1;
  }
  return (Index)uVar3;
}

Assistant:

Index Module::GetFuncTypeIndex(const FuncSignature& sig) const {
  for (size_t i = 0; i < func_types.size(); ++i) {
    if (func_types[i]->sig == sig) {
      return i;
    }
  }
  return kInvalidIndex;
}